

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::DefaultTextureImageLoaderFunction
               (AssetPath *assetPath,AssetInfo *assetInfo,AssetResolutionResolver *assetResolver,
               TextureImage *texImageOut,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *imageData,void *userdata,
               string *warn,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  TextureImage *args;
  Asset *asset_out;
  char *pcVar4;
  ulong *puVar5;
  size_type *psVar6;
  PixelFormat fmt;
  tinyusdz *this;
  char *pcVar7;
  undefined4 uVar8;
  Asset asset;
  TextureImage texImage;
  string resolvedPath;
  expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Asset local_1f0;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  int iStack_140;
  undefined4 uStack_13c;
  int64_t local_138;
  uint64_t uStack_130;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [56];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90 [3];
  bool local_38;
  
  if (texImageOut == (TextureImage *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar7 = (char *)err->_M_string_length;
    pcVar4 = "`imageOut` argument is nullptr\n";
LAB_00357731:
    ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar7,(ulong)pcVar4);
    return false;
  }
  if (imageData == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar7 = (char *)err->_M_string_length;
    pcVar4 = "`imageData` argument is nullptr\n";
    goto LAB_00357731;
  }
  args = texImageOut;
  AssetResolutionResolver::resolve(&local_128,assetResolver,(string *)assetPath);
  if (local_128._M_string_length == 0) {
    if (err != (string *)0x0) {
      paVar1 = &local_1f0.version_.field_2;
      local_1f0.version_._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"Failed to resolve asset path: {}\n","");
      tinyusdz::fmt::format<std::__cxx11::string>
                ((string *)local_c8,(fmt *)&local_1f0,&assetPath->asset_path_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::_M_append((char *)err,local_c8._0_8_);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.version_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0.version_._M_dataplus._M_p,
                        CONCAT71(local_1f0.version_.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.version_.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar2 = false;
    goto LAB_00357b4d;
  }
  local_1f0.version_._M_dataplus._M_p = (pointer)&local_1f0.version_.field_2;
  local_1f0.version_._M_string_length = 0;
  local_1f0.version_.field_2._M_local_buf[0] = '\0';
  local_1f0.name_._M_dataplus._M_p = (pointer)&local_1f0.name_.field_2;
  local_1f0.name_._M_string_length = 0;
  local_1f0.name_.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_1f0.resolved_name_.field_2;
  local_1f0.resolved_name_._M_string_length = 0;
  local_1f0.resolved_name_.field_2._M_local_buf[0] = '\0';
  local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_out = &local_1f0;
  local_1f0.resolved_name_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = AssetResolutionResolver::open_asset
                    (assetResolver,&local_128,(string *)assetPath,asset_out,warn,err);
  if (bVar2) {
    image::LoadImageFromMemory
              ((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,
               local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (long)local_1f0.buf_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1f0.buf_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_128);
    if (local_38 == false) {
      if (err == (string *)0x0) {
        bVar2 = false;
      }
      else {
        ::std::operator+(&local_210,"Failed to load image file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_210);
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_168 = *puVar5;
          lStack_160 = plVar3[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *puVar5;
          local_178 = (ulong *)*plVar3;
        }
        local_170 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_178);
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
    }
    else {
      uVar8 = 0;
      local_170 = 0;
      local_168 = local_168 & 0xffffffffffffff00;
      local_158 = 0;
      uStack_150 = 0;
      local_148 = 0xffffffffffffffff;
      iStack_140 = -1;
      uStack_13c = 0;
      local_138 = -1;
      uStack_130 = 0;
      local_178 = &local_168;
      ::std::__cxx11::string::_M_assign((string *)&local_178);
      if (local_38 == false) goto LAB_00357b83;
      iStack_140 = local_c8._40_4_;
      if (local_c8._44_4_ == 8) {
LAB_00357692:
        local_158 = CONCAT44(uVar8,(undefined4)local_158);
        local_148 = local_c8._32_8_;
        ::std::__cxx11::string::_M_assign((string *)texImageOut);
        texImageOut->buffer_id = local_138;
        texImageOut->handle = uStack_130;
        texImageOut->width = (undefined4)local_148;
        texImageOut->height = local_148._4_4_;
        texImageOut->channels = iStack_140;
        texImageOut->miplevel = uStack_13c;
        texImageOut->texelComponentType = (undefined4)local_158;
        texImageOut->assetTexelComponentType = local_158._4_4_;
        texImageOut->colorSpace = (undefined4)uStack_150;
        texImageOut->usdColorSpace = uStack_150._4_4_;
        if (local_38 == false) {
LAB_00357b83:
          __assert_fail("false && detail::text(\"throw bad_expected_access<Error>{ e };\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                        ,0x647,
                        "static void nonstd::expected_lite::error_traits<std::basic_string<char>>::rethrow(const Error &) [Error = std::basic_string<char>]"
                       );
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(imageData,local_90);
        bVar2 = true;
      }
      else {
        if (local_c8._44_4_ == 0x10) {
          this = (tinyusdz *)(ulong)(uint)local_c8._48_4_;
          if (this < (tinyusdz *)0x3) {
            uVar8 = *(undefined4 *)(&DAT_0060e234 + (long)this * 4);
            goto LAB_00357692;
          }
          if (err == (string *)0x0) goto LAB_00357a18;
          tinyusdz::to_string_abi_cxx11_(&local_108,this,fmt);
          pcVar7 = "Invalid image.pixelformat: ";
        }
        else {
          if (err == (string *)0x0) {
LAB_00357a18:
            bVar2 = false;
            goto LAB_00357ac1;
          }
          ::std::__cxx11::to_string(&local_108,local_c8._44_4_);
          pcVar7 = "TODO or unsupported bpp: ";
        }
        ::std::operator+(&local_e8,pcVar7,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_e8);
        psVar6 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_210.field_2._M_allocated_capacity = *psVar6;
          local_210.field_2._8_8_ = plVar3[3];
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        }
        else {
          local_210.field_2._M_allocated_capacity = *psVar6;
          local_210._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_210._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
LAB_00357ac1:
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
    }
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c8);
  }
  else if (err == (string *)0x0) {
    bVar2 = false;
  }
  else {
    local_178 = &local_168;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Failed to open asset: {}","");
    tinyusdz::fmt::format<std::__cxx11::string>
              ((string *)local_c8,(fmt *)&local_178,(string *)&local_128,&asset_out->version_);
    ::std::__cxx11::string::_M_append((char *)err,local_c8._0_8_);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    bVar2 = false;
  }
  if (local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_1f0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.resolved_name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.resolved_name_._M_dataplus._M_p,
                    CONCAT71(local_1f0.resolved_name_.field_2._M_allocated_capacity._1_7_,
                             local_1f0.resolved_name_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.name_._M_dataplus._M_p != &local_1f0.name_.field_2) {
    operator_delete(local_1f0.name_._M_dataplus._M_p,
                    CONCAT71(local_1f0.name_.field_2._M_allocated_capacity._1_7_,
                             local_1f0.name_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.version_._M_dataplus._M_p != &local_1f0.version_.field_2) {
    operator_delete(local_1f0.version_._M_dataplus._M_p,
                    CONCAT71(local_1f0.version_.field_2._M_allocated_capacity._1_7_,
                             local_1f0.version_.field_2._M_local_buf[0]) + 1);
  }
LAB_00357b4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool DefaultTextureImageLoaderFunction(
    const value::AssetPath &assetPath, const AssetInfo &assetInfo,
    const AssetResolutionResolver &assetResolver, TextureImage *texImageOut,
    std::vector<uint8_t> *imageData, void *userdata, std::string *warn,
    std::string *err) {
  if (!texImageOut) {
    if (err) {
      (*err) = "`imageOut` argument is nullptr\n";
    }
    return false;
  }

  if (!imageData) {
    if (err) {
      (*err) = "`imageData` argument is nullptr\n";
    }
    return false;
  }

  // TODO: assetInfo
  (void)assetInfo;
  (void)userdata;
  (void)warn;

  std::string resolvedPath = assetResolver.resolve(assetPath.GetAssetPath());

  if (resolvedPath.empty()) {
    if (err) {
      (*err) += fmt::format("Failed to resolve asset path: {}\n",
                            assetPath.GetAssetPath());
    }
    return false;
  }

  Asset asset;
  bool ret = assetResolver.open_asset(resolvedPath, assetPath.GetAssetPath(),
                                      &asset, warn, err);
  if (!ret) {
    if (err) {
      (*err) += fmt::format("Failed to open asset: {}", resolvedPath);
    }
    return false;
  }

  DCOUT("Resolved asset path = " << resolvedPath);

  // TODO: user-defined image loader handler.
  auto result = tinyusdz::image::LoadImageFromMemory(asset.data(), asset.size(),
                                                     resolvedPath);
  if (!result) {
    if (err) {
      (*err) += "Failed to load image file: " + result.error() + "\n";
    }
    return false;
  }

  TextureImage texImage;

  texImage.asset_identifier = resolvedPath;
  texImage.channels = result.value().image.channels;

  const auto &imgret = result.value();

  if (imgret.image.bpp == 8) {
    // assume uint8
    texImage.assetTexelComponentType = ComponentType::UInt8;
  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt16;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int16;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Half;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }

  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt32;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int32;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Float;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }
  } else {
    DCOUT("TODO: bpp = " << result.value().image.bpp);
    if (err) {
      (*err) += "TODO or unsupported bpp: " +
               std::to_string(result.value().image.bpp) + "\n";
    }
    return false;
  }

  texImage.channels = result.value().image.channels;
  texImage.width = result.value().image.width;
  texImage.height = result.value().image.height;

  (*texImageOut) = texImage;

  // raw image data
  (*imageData) = result.value().image.data;

  return true;
}